

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ParameterSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ParameterSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation&,bool&,bool&>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1,bool *args_2,bool *args_3)

{
  bool bVar1;
  bool bVar2;
  string_view name;
  ParameterSymbol *this_00;
  
  this_00 = (ParameterSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ParameterSymbol *)this->endPtr < this_00 + 1) {
    this_00 = (ParameterSymbol *)allocateSlow(this,0x178,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  name._M_len = args->_M_len;
  name._M_str = args->_M_str;
  bVar1 = *args_2;
  bVar2 = *args_3;
  ast::ValueSymbol::ValueSymbol
            (&this_00->super_ValueSymbol,Parameter,name,*args_1,
             (bitmask<slang::ast::DeclaredTypeFlags>)0x1003);
  (this_00->super_ParameterSymbolBase).symbol = (Symbol *)this_00;
  (this_00->super_ParameterSymbolBase).defaultValSyntax = (SyntaxNode *)0x0;
  (this_00->super_ParameterSymbolBase).isLocal = bVar1;
  (this_00->super_ParameterSymbolBase).isPort = bVar2;
  this_00->value = (ConstantValue *)0x0;
  *(undefined8 *)((long)&this_00->value + 5) = 0;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }